

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O2

void update_retrig(DUMB_IT_SIGRENDERER *sigrenderer,IT_CHANNEL *channel)

{
  int iVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  
  if (channel->xm_retrig != '\0') {
    iVar1 = channel->retrig_tick;
    channel->retrig_tick = iVar1 + -1;
    if (1 < iVar1) {
      return;
    }
    if (channel->playing == (IT_PLAYING *)0x0) {
      if ((sigrenderer->sigdata->flags & 0x40) != 0) {
        it_retrigger_note(sigrenderer,channel);
      }
    }
    else {
      it_playing_reset_resamplers(channel->playing,0);
      channel->playing->declick_stage = '\0';
    }
    bVar2 = channel->xm_retrig;
    goto LAB_00585a28;
  }
  bVar2 = channel->retrig;
  if ((bVar2 & 0xf) == 0) {
    return;
  }
  iVar1 = channel->retrig_tick;
  channel->retrig_tick = iVar1 + -1;
  if (1 < iVar1) {
    return;
  }
  if (bVar2 < 0x10) goto LAB_005859eb;
  if (bVar2 < 0x20) {
    bVar2 = channel->volume - 1;
LAB_005859de:
    if (0x40 < bVar2) {
      bVar2 = 0;
    }
    channel->volume = bVar2;
  }
  else {
    if (bVar2 < 0x30) {
      bVar2 = channel->volume - 2;
      goto LAB_005859de;
    }
    if (bVar2 < 0x40) {
      bVar2 = channel->volume - 4;
      goto LAB_005859de;
    }
    if (bVar2 < 0x50) {
      bVar2 = channel->volume - 8;
      goto LAB_005859de;
    }
    if (bVar2 < 0x60) {
      bVar2 = channel->volume - 0x10;
      goto LAB_005859de;
    }
    if (bVar2 < 0x70) {
      channel->volume = (byte)(channel->volume * '\x02') / 3;
    }
    else if ((char)bVar2 < '\0') {
      if (0x8f < bVar2) {
        if (bVar2 < 0xa0) {
          bVar2 = channel->volume + 1;
LAB_00585a89:
          bVar4 = bVar2 < 0x40;
        }
        else {
          if (bVar2 < 0xb0) {
            bVar2 = channel->volume + 2;
            goto LAB_00585a89;
          }
          if (bVar2 < 0xc0) {
            bVar2 = channel->volume + 4;
            goto LAB_00585a89;
          }
          if (bVar2 < 0xd0) {
            bVar2 = channel->volume + 8;
            goto LAB_00585a89;
          }
          if (bVar2 < 0xe0) {
            bVar2 = channel->volume + 0x10;
            goto LAB_00585a89;
          }
          if (0xef < bVar2) {
            bVar2 = channel->volume * '\x02';
            goto LAB_00585a89;
          }
          bVar3 = channel->volume * '\x03';
          bVar2 = bVar3 >> 1;
          bVar4 = bVar3 < 0x82;
        }
        bVar3 = 0x40;
        if (bVar4) {
          bVar3 = bVar2;
        }
        channel->volume = bVar3;
      }
    }
    else {
      channel->volume = channel->volume >> 1;
    }
  }
LAB_005859eb:
  if (channel->playing == (IT_PLAYING *)0x0) {
    if ((sigrenderer->sigdata->flags & 0x40) != 0) {
      it_retrigger_note(sigrenderer,channel);
    }
  }
  else {
    it_playing_reset_resamplers(channel->playing,0);
    channel->playing->declick_stage = '\0';
  }
  bVar2 = channel->retrig & 0xf;
LAB_00585a28:
  channel->retrig_tick = (uint)bVar2;
  return;
}

Assistant:

static void update_retrig(DUMB_IT_SIGRENDERER *sigrenderer, IT_CHANNEL *channel)
{
	if (channel->xm_retrig) {
		channel->retrig_tick--;
		if (channel->retrig_tick <= 0) {
			if (channel->playing) {
				it_playing_reset_resamplers(channel->playing, 0);
				channel->playing->declick_stage = 0;
			} else if (sigrenderer->sigdata->flags & IT_WAS_AN_XM) it_retrigger_note(sigrenderer, channel);
			channel->retrig_tick = channel->xm_retrig;
		}
	} else if (channel->retrig & 0x0F) {
		channel->retrig_tick--;
		if (channel->retrig_tick <= 0) {
			if (channel->retrig < 0x10) {
			} else if (channel->retrig < 0x20) {
				channel->volume--;
				if (channel->volume > 64) channel->volume = 0;
			} else if (channel->retrig < 0x30) {
				channel->volume -= 2;
				if (channel->volume > 64) channel->volume = 0;
			} else if (channel->retrig < 0x40) {
				channel->volume -= 4;
				if (channel->volume > 64) channel->volume = 0;
			} else if (channel->retrig < 0x50) {
				channel->volume -= 8;
				if (channel->volume > 64) channel->volume = 0;
			} else if (channel->retrig < 0x60) {
				channel->volume -= 16;
				if (channel->volume > 64) channel->volume = 0;
			} else if (channel->retrig < 0x70) {
				channel->volume <<= 1;
				channel->volume /= 3;
			} else if (channel->retrig < 0x80) {
				channel->volume >>= 1;
			} else if (channel->retrig < 0x90) {
			} else if (channel->retrig < 0xA0) {
				channel->volume++;
				if (channel->volume > 64) channel->volume = 64;
			} else if (channel->retrig < 0xB0) {
				channel->volume += 2;
				if (channel->volume > 64) channel->volume = 64;
			} else if (channel->retrig < 0xC0) {
				channel->volume += 4;
				if (channel->volume > 64) channel->volume = 64;
			} else if (channel->retrig < 0xD0) {
				channel->volume += 8;
				if (channel->volume > 64) channel->volume = 64;
			} else if (channel->retrig < 0xE0) {
				channel->volume += 16;
				if (channel->volume > 64) channel->volume = 64;
			} else if (channel->retrig < 0xF0) {
				channel->volume *= 3;
				channel->volume >>= 1;
				if (channel->volume > 64) channel->volume = 64;
			} else {
				channel->volume <<= 1;
				if (channel->volume > 64) channel->volume = 64;
			}
			if (channel->playing) {
				it_playing_reset_resamplers(channel->playing, 0);
				channel->playing->declick_stage = 0;
			} else if (sigrenderer->sigdata->flags & IT_WAS_AN_XM) it_retrigger_note(sigrenderer, channel);
			channel->retrig_tick = channel->retrig & 0x0F;
		}
	}
}